

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_getfloat(HSQUIRRELVM v,SQInteger idx,SQFloat *f)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQRESULT SVar3;
  SQFloat SVar4;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar1 = (pSVar2->super_SQObject)._type;
  SVar3 = -1;
  if ((SVar1 >> 0x1a & 1) != 0) {
    if (SVar1 == OT_INTEGER) {
      SVar4 = (SQFloat)(pSVar2->super_SQObject)._unVal.nInteger;
    }
    else {
      SVar4 = (pSVar2->super_SQObject)._unVal.fFloat;
    }
    *f = SVar4;
    SVar3 = 0;
  }
  return SVar3;
}

Assistant:

SQRESULT sq_getfloat(HSQUIRRELVM v,SQInteger idx,SQFloat *f)
{
    SQObjectPtr &o = stack_get(v, idx);
    if(sq_isnumeric(o)) {
        *f = tofloat(o);
        return SQ_OK;
    }
    return SQ_ERROR;
}